

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

_Bool mon_take_nonplayer_hit(wchar_t dam,monster *t_mon,mon_messages hurt_msg,mon_messages die_msg)

{
  _Bool _Var1;
  mon_messages die_msg_local;
  mon_messages hurt_msg_local;
  monster *t_mon_local;
  wchar_t dam_local;
  
  if (t_mon == (monster *)0x0) {
    __assert_fail("t_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-util.c"
                  ,0x4ab,
                  "_Bool mon_take_nonplayer_hit(int, struct monster *, enum mon_messages, enum mon_messages)"
                 );
  }
  _Var1 = monster_is_unique(t_mon);
  t_mon_local._0_4_ = dam;
  if (((_Var1) || ((player->upkeep->arena_level & 1U) != 0)) && (t_mon->hp < dam)) {
    t_mon_local._0_4_ = (wchar_t)t_mon->hp;
  }
  if (player->upkeep->health_who == t_mon) {
    player->upkeep->redraw = player->upkeep->redraw | 0x200;
  }
  monster_wake(t_mon,false,L'\0');
  t_mon->hp = t_mon->hp - (short)(wchar_t)t_mon_local;
  if (t_mon->hp < 0) {
    add_monster_message(t_mon,die_msg,false);
    monster_death(t_mon,player,false);
    delete_monster_idx((chunk *)cave,t_mon->midx);
    t_mon_local._7_1_ = true;
  }
  else {
    _Var1 = monster_is_camouflaged(t_mon);
    if (!_Var1) {
      if (hurt_msg == MON_MSG_NONE) {
        if (L'\0' < (wchar_t)t_mon_local) {
          message_pain(t_mon,(wchar_t)t_mon_local);
        }
      }
      else {
        add_monster_message(t_mon,hurt_msg,false);
      }
    }
    if ((t_mon->m_timed[3] == 0) && (L'\0' < (wchar_t)t_mon_local)) {
      monster_scared_by_damage(t_mon,(wchar_t)t_mon_local);
    }
    t_mon_local._7_1_ = false;
  }
  return t_mon_local._7_1_;
}

Assistant:

bool mon_take_nonplayer_hit(int dam, struct monster *t_mon,
							enum mon_messages hurt_msg,
							enum mon_messages die_msg)
{
	assert(t_mon);

	/* "Unique" or arena monsters can only be "killed" by the player */
	if (monster_is_unique(t_mon) || player->upkeep->arena_level) {
		/* Reduce monster hp to zero, but don't kill it. */
		if (dam > t_mon->hp) dam = t_mon->hp;
	}

	/* Redraw (later) if needed */
	if (player->upkeep->health_who == t_mon)
		player->upkeep->redraw |= (PR_HEALTH);

	/* Wake the monster up, doesn't become aware of the player */
	monster_wake(t_mon, false, 0);

	/* Hurt the monster */
	t_mon->hp -= dam;

	/* Dead or damaged monster */
	if (t_mon->hp < 0) {
		/* Death message */
		add_monster_message(t_mon, die_msg, false);

		/* Generate treasure, etc */
		monster_death(t_mon, player, false);

		/* Delete the monster */
		delete_monster_idx(cave, t_mon->midx);
		return true;
	} else if (!monster_is_camouflaged(t_mon)) {
		/* Give detailed messages if visible */
		if (hurt_msg != MON_MSG_NONE) {
			add_monster_message(t_mon, hurt_msg, false);
		} else if (dam > 0) {
			message_pain(t_mon, dam);
		}
	}

	/* Sometimes a monster gets scared by damage */
	if (!t_mon->m_timed[MON_TMD_FEAR] && dam > 0) {
		(void) monster_scared_by_damage(t_mon, dam);
	}

	return false;
}